

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int linux_kqueue_init(kqueue *kq)

{
  int iVar1;
  int iVar2;
  int *in_RDI;
  f_owner_ex sig_owner;
  kqueue *in_stack_ffffffffffffffd8;
  undefined4 local_18;
  pid_t local_14;
  int *local_10;
  
  local_10 = in_RDI;
  iVar1 = epoll_create1(0x80000);
  local_10[0x1f0] = iVar1;
  if (-1 < local_10[0x1f0]) {
    iVar1 = pipe2(local_10 + 0x1f1,0x80000);
    if (iVar1 == 0) {
      iVar1 = filter_register_all(in_stack_ffffffffffffffd8);
      if (((-1 < iVar1) && (iVar1 = fcntl(local_10[0x1f1],4,0x2800), -1 < iVar1)) &&
         (iVar1 = fcntl(local_10[0x1f2],4,0x800), -1 < iVar1)) {
        *local_10 = local_10[0x1f2];
        iVar1 = local_10[0x1f1];
        iVar2 = __libc_current_sigrtmin();
        iVar1 = fcntl(iVar1,10,(ulong)(iVar2 + 1));
        if ((-1 < iVar1) &&
           ((monitoring_tid != 0 || (iVar1 = linux_kqueue_start_thread(), -1 < iVar1)))) {
          fd_map[local_10[0x1f1]] = *local_10;
          fd_use_cnt[*local_10] = fd_use_cnt[*local_10] + 1;
          local_18 = 0;
          local_14 = monitoring_tid;
          iVar1 = fcntl(local_10[0x1f1],0xf,&local_18);
          if (-1 < iVar1) {
            return 0;
          }
          pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
        }
      }
      close(local_10[0x1f0]);
      local_10[0x1f0] = -1;
      close(local_10[0x1f1]);
      local_10[0x1f1] = -1;
      close(local_10[0x1f2]);
      local_10[0x1f2] = -1;
    }
    else {
      close(local_10[0x1f0]);
      local_10[0x1f0] = -1;
    }
  }
  return -1;
}

Assistant:

static int
linux_kqueue_init(struct kqueue *kq)
{
    struct f_owner_ex sig_owner;

    kq->epollfd = epoll_create1(EPOLL_CLOEXEC);
    if (kq->epollfd < 0) {
        dbg_perror("epoll_create(2)");
        return (-1);
    }

    /*
     * The standard behaviour when closing a kqueue fd is
     * for the underlying resources to be freed.
     * In order to catch the close on the libkqueue fd,
     * we use a pipe and return the write end as kq_id.
     * Closing the end will cause the pipe to be close which
     * will be caught by the monitoring thread.
     */
    if (pipe2(kq->pipefd, O_CLOEXEC)) {
        if (close(kq->epollfd) < 0)
            dbg_perror("close(2)");
        kq->epollfd = -1;

        return (-1);
    }

    if (filter_register_all(kq) < 0) {
    error:
        if (close(kq->epollfd) < 0)
            dbg_perror("close(2)");
        kq->epollfd = -1;

        if (close(kq->pipefd[0]) < 0)
            dbg_perror("close(2)");
        kq->pipefd[0] = -1;

        if (close(kq->pipefd[1]) < 0)
            dbg_perror("close(2)");
        kq->pipefd[1] = -1;

        return (-1);
    }

    /*
     * O_NONBLOCK - Ensure pipe ends are non-blocking so that
     * there's no chance of them delaying close().
     *
     * O_ASYNC - Raise a SIGIO signal if the file descriptor
     * becomes readable or is closed.
     */
    if ((fcntl(kq->pipefd[0], F_SETFL, O_NONBLOCK | O_ASYNC ) < 0) ||
        (fcntl(kq->pipefd[1], F_SETFL, O_NONBLOCK) < 0)) {
        dbg_perror("fcntl(2)");
        goto error;
    }

    kq->kq_id = kq->pipefd[1];

    /*
     * SIGIO may be used by the application, so we use F_SETSIG
     * to change the signal sent to one in the realtime range
     * which are all user defined.
     *
     * We may want to make this configurable at runtime later
     * so we won't conflict with the application.
     *
     * Note: MONITORING_THREAD_SIGNAL must be >= SIGRTMIN so that
     * multiple signals are queued.
     */
    if (fcntl(kq->pipefd[0], F_SETSIG, MONITORING_THREAD_SIGNAL) < 0) {
        dbg_printf("fd=%i - failed setting F_SETSIG sig=%u: %s",
                   kq->pipefd[0], MONITORING_THREAD_SIGNAL, strerror(errno));
        goto error;
    }

    /* Start monitoring thread during first initialization */
    if (monitoring_tid == 0) {
        if (linux_kqueue_start_thread() < 0)
            goto error;
    }

    /* Update pipe FD map */
    fd_map[kq->pipefd[0]] = kq->kq_id;

    /* Mark this id as in use */
    fd_use_cnt[kq->kq_id]++;

    dbg_printf("kq=%p - fd=%i use_count=%u", kq, kq->kq_id, fd_use_cnt[kq->kq_id]);

    assert(monitoring_tid != 0);

    /*
     * Finally, ensure that signals generated by I/O operations
     * on the FD get dispatch to the monitoring thread, and
     * not anywhere else.
     */
    sig_owner.type = F_OWNER_TID;
    sig_owner.pid = monitoring_tid;
    if (fcntl(kq->pipefd[0], F_SETOWN_EX, &sig_owner) < 0) {
        dbg_printf("fd=%i - failed setting F_SETOWN to tid=%u: %s", monitoring_tid, kq->kq_id, strerror(errno));
        tracing_mutex_unlock(&kq_mtx);
        goto error;
    }
    dbg_printf("kq=%p - monitoring fd=%i for closure", kq, kq->pipefd[0]);

    return (0);
}